

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamUtils.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
fw::loadStream(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
              istream *stream)

{
  size_type __n;
  logic_error *this;
  allocator_type local_19;
  
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
    std::istream::seekg((long)stream,_S_beg);
    __n = std::istream::tellg();
    std::istream::seekg((long)stream,_S_beg);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,__n,&local_19);
    std::istream::read((char *)stream,
                       (long)(__return_storage_ptr__->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start);
    return __return_storage_ptr__;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"Stream is in fail state.");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::vector<unsigned char> loadStream(std::istream& stream)
{
    if (stream.fail())
    {
        throw std::logic_error("Stream is in fail state.");
    }

    stream.seekg(0, stream.end);
    auto length = stream.tellg();
    stream.seekg(0, stream.beg);

    std::vector<unsigned char> buffer(length);
    stream.read(reinterpret_cast<char*>(buffer.data()), length);

    return buffer;
}